

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::lookingAtEndOfLine(SelectionCompiler *this)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  int iVar4;
  
  iVar2 = this->ichToken;
  if (iVar2 != this->cchScript) {
    pcVar3 = (this->script)._M_dataplus._M_p;
    cVar1 = pcVar3[iVar2];
    if (cVar1 == '\n') {
      iVar4 = iVar2 + 1;
    }
    else {
      if (cVar1 != '\r') {
        return false;
      }
      iVar4 = iVar2 + 1;
      if ((iVar4 < this->cchScript) && (pcVar3[(long)iVar2 + 1] == '\n')) {
        iVar4 = iVar2 + 2;
      }
    }
    this->cchToken = iVar4 - iVar2;
  }
  return true;
}

Assistant:

bool SelectionCompiler::lookingAtEndOfLine() {
    if (ichToken == cchScript) return true;
    int ichT = ichToken;
    char ch  = script[ichT];
    if (ch == '\r') {
      ++ichT;
      if (ichT < cchScript && script[ichT] == '\n') ++ichT;
    } else if (ch == '\n') {
      ++ichT;
    } else {
      return false;
    }
    cchToken = ichT - ichToken;
    return true;
  }